

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int btreeLast(BtCursor *pCur,int *pRes)

{
  int iVar1;
  
  iVar1 = moveToRoot(pCur);
  if (iVar1 == 0x10) {
    *pRes = 1;
  }
  else {
    if (iVar1 != 0) {
      return iVar1;
    }
    *pRes = 0;
    iVar1 = moveToRightmost(pCur);
    if (iVar1 != 0) {
      pCur->curFlags = pCur->curFlags & 0xf7;
      return iVar1;
    }
    pCur->curFlags = pCur->curFlags | 8;
  }
  return 0;
}

Assistant:

static SQLITE_NOINLINE int btreeLast(BtCursor *pCur, int *pRes){
  int rc = moveToRoot(pCur);
  if( rc==SQLITE_OK ){
    assert( pCur->eState==CURSOR_VALID );
    *pRes = 0;
    rc = moveToRightmost(pCur);
    if( rc==SQLITE_OK ){
      pCur->curFlags |= BTCF_AtLast;
    }else{
      pCur->curFlags &= ~BTCF_AtLast;
    }
  }else if( rc==SQLITE_EMPTY ){
    assert( pCur->pgnoRoot==0 || pCur->pPage->nCell==0 );
    *pRes = 1;
    rc = SQLITE_OK;
  }
  return rc;
}